

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O0

bool __thiscall
ON_NurbsCurve::InsertKnot(ON_NurbsCurve *this,double knot_value,int knot_multiplicity)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  double *pdVar6;
  byte local_71;
  int local_68;
  int local_64;
  int i1;
  int i0;
  int new_knot_count;
  int span_hint;
  int span_index;
  bool bIsPeriodic;
  ON_Interval d;
  double t1;
  double t0;
  bool local_25;
  int degree;
  bool rc;
  int knot_multiplicity_local;
  double knot_value_local;
  ON_NurbsCurve *this_local;
  
  iVar3 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x2c])();
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
  bVar2 = ON_Interval::IsIncreasing((ON_Interval *)&span_index);
  if (bVar2) {
    pdVar6 = ON_Interval::operator[]((ON_Interval *)&span_index,0);
    dVar1 = *pdVar6;
    pdVar6 = ON_Interval::operator[]((ON_Interval *)&span_index,1);
    d.m_t[1] = *pdVar6;
    if ((knot_multiplicity < 1) || (iVar3 < knot_multiplicity)) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_nurbscurve.cpp"
                 ,0x9d3,"",
                 "ON_NurbsCurve::ON_InsertKnot(): knot_multiplicity < 1 or knot_multiplicity > degree."
                );
      this_local._7_1_ = false;
    }
    else if ((knot_value < dVar1) || (d.m_t[1] < knot_value)) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_nurbscurve.cpp"
                 ,0x9d9,"","ON_InsertKnot(): knot_value not in NURBS curve domain.");
      this_local._7_1_ = false;
    }
    else if ((knot_value != dVar1) || (NAN(knot_value) || NAN(dVar1))) {
      if ((knot_value != d.m_t[1]) || (NAN(knot_value) || NAN(d.m_t[1]))) {
        ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
        if (iVar3 < 2) {
          local_71 = 0;
        }
        else {
          iVar4 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x35])
                            ();
          local_71 = (byte)iVar4;
        }
        span_hint._3_1_ = local_71 & 1;
        new_knot_count =
             ON_NurbsSpanIndex(this->m_order,this->m_cv_count,this->m_knot,knot_value,0,0);
        bVar2 = ReserveCVCapacity(this,this->m_cv_stride * (this->m_cv_count + knot_multiplicity));
        if (bVar2) {
          iVar4 = KnotCount(this);
          bVar2 = ReserveKnotCapacity(this,iVar4 + knot_multiplicity);
          if (bVar2) {
            i0 = new_knot_count;
            iVar4 = CVSize(this);
            iVar4 = ON_InsertKnot(knot_value,knot_multiplicity,iVar4,this->m_order,this->m_cv_count,
                                  this->m_cv_stride,this->m_cv,this->m_knot,&i0);
            if (0 < iVar4) {
              this->m_cv_count = iVar4 + this->m_cv_count;
            }
            if (((span_hint._3_1_ & 1) != 0) &&
               (uVar5 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                          [0x35])(), (uVar5 & 1) == 0)) {
              bVar2 = ON_MakeKnotVectorPeriodic(this->m_order,this->m_cv_count,this->m_knot);
              if (bVar2) {
                local_64 = 0;
                local_68 = this->m_cv_count - iVar3;
                for (; local_64 < iVar3; local_64 = local_64 + 1) {
                  if (new_knot_count < local_64) {
                    pdVar6 = CV(this,local_64);
                    SetCV(this,local_68,intrinsic_point_style,pdVar6);
                  }
                  else {
                    pdVar6 = CV(this,local_68);
                    SetCV(this,local_64,intrinsic_point_style,pdVar6);
                  }
                  local_68 = local_68 + 1;
                }
              }
              else {
                ClampEnd(this,2);
              }
            }
            this_local._7_1_ = true;
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        if (knot_multiplicity == iVar3) {
          local_25 = ClampEnd(this,1);
        }
        else {
          if (knot_multiplicity != 1) {
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_nurbscurve.cpp"
                       ,0x9fb,"",
                       "ON_InsertKnot(): knot_value = t1 and 1 < knot_multiplicity < degree.");
          }
          local_25 = knot_multiplicity == 1;
        }
        this_local._7_1_ = local_25;
      }
    }
    else {
      if (knot_multiplicity == iVar3) {
        local_25 = ClampEnd(this,0);
      }
      else {
        if (knot_multiplicity != 1) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_nurbscurve.cpp"
                     ,0x9e9,"",
                     "ON_InsertKnot(): knot_value = t0 and 1 < knot_multiplicity < degree.");
        }
        local_25 = knot_multiplicity == 1;
      }
      this_local._7_1_ = local_25;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_NurbsCurve::InsertKnot( double knot_value, int knot_multiplicity )
{
  bool rc = false;

  const int degree = Degree();

  double t0, t1;
  {
    ON_Interval d = Domain();
    if ( !d.IsIncreasing() )
      return false;
    t0 = d[0];
    t1 = d[1];
  }
  
  if ( knot_multiplicity < 1 || knot_multiplicity > degree ) 
  {
    ON_ERROR("ON_NurbsCurve::ON_InsertKnot(): knot_multiplicity < 1 or knot_multiplicity > degree.");
    return false;
  }

  if( knot_value < t0 || knot_value > t1 )
  {
    ON_ERROR("ON_InsertKnot(): knot_value not in NURBS curve domain.");
    return false;
  }

  if ( knot_value == t0 ) 
  {
    if ( knot_multiplicity == degree ) 
    {
      rc = ClampEnd(0);
    }
    else if ( knot_multiplicity == 1 ) 
    {
      rc = true;
    }
    else 
    {
      ON_ERROR("ON_InsertKnot(): knot_value = t0 and 1 < knot_multiplicity < degree.");
      rc = false;
    }
    return rc;
  }

  if ( knot_value == t1 ) 
  {
    if ( knot_multiplicity == degree ) 
    {
      rc = ClampEnd(1);
    }
    else if ( knot_multiplicity == 1 ) 
    {
      rc = true;
    }
    else 
    {
      ON_ERROR("ON_InsertKnot(): knot_value = t1 and 1 < knot_multiplicity < degree.");
      rc = false;
    }
    return rc;
  }

  DestroyCurveTree();

  bool bIsPeriodic = (degree>1) ? IsPeriodic() : false;
  int span_index = ON_NurbsSpanIndex( m_order, m_cv_count, m_knot, knot_value, 0, 0 );

  // reserve room for new knots and cvs
  if ( !ReserveCVCapacity( m_cv_stride*(m_cv_count+knot_multiplicity) ) )
    return false;
  if ( !ReserveKnotCapacity( KnotCount()+knot_multiplicity ) )
    return false;
  if ( bIsPeriodic ) {
  }

  rc = true;
  int span_hint = span_index;
  int new_knot_count = ON_InsertKnot( knot_value, knot_multiplicity, 
                                      CVSize(), m_order, m_cv_count, 
                                      m_cv_stride, m_cv, m_knot, &span_hint );
  if ( new_knot_count > 0 ) 
  {
    m_cv_count += new_knot_count;
  }

  if ( bIsPeriodic && rc && !IsPeriodic() ) {
    // restore periodic form
    if ( ON_MakeKnotVectorPeriodic( m_order, m_cv_count, m_knot ) ) {
      int i0, i1;
      for ( i0 = 0, i1 = m_cv_count-degree; i0 < degree; i0++, i1++ ) {
        //14 May 2015 - Chuck - Fix for curves with low span count.  See RH-30358
        //if ( span_index < degree-1)
        if (i0 > span_index)
          SetCV( i1, ON::intrinsic_point_style, CV(i0) ); // cv[i1] = cv[i0]
        else
          SetCV( i0, ON::intrinsic_point_style, CV(i1) ); // cv[i0] = cv[i1]
      }
    }
    else {
      ClampEnd(2);
    }
  }

  return rc;
}